

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_pass(REF_GRID ref_grid)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  REF_NODE pRVar4;
  REF_CAVITY pRVar5;
  REF_GRID ref_grid_00;
  REF_STATUS RVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  undefined8 uVar10;
  int *piVar11;
  ulong uVar12;
  REF_CELL pRVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  REF_INT RVar17;
  long lVar18;
  bool bVar19;
  REF_CELL pRVar20;
  REF_BOOL allowed;
  REF_CAVITY ref_cavity;
  REF_DBL min_add;
  REF_DBL min_del;
  REF_BOOL has_triangle;
  REF_DBL quality;
  REF_INT degree;
  REF_BOOL improved;
  REF_BOOL conforming;
  REF_BOOL manifold;
  REF_BOOL same_face;
  REF_INT nodes [27];
  uint local_140;
  uint local_13c;
  REF_GRID local_138;
  REF_CELL local_130;
  REF_CELL local_128;
  uint local_120;
  uint local_11c;
  undefined8 local_118;
  undefined8 local_110;
  REF_CAVITY local_108;
  int local_fc;
  double local_f8;
  int local_ec;
  long local_e8;
  long local_e0;
  REF_NODE local_d8;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  REF_NODE local_b8;
  long local_b0;
  uint local_a8 [30];
  
  pRVar13 = ref_grid->cell[8];
  local_138 = ref_grid;
  if (0 < pRVar13->max) {
    local_b8 = ref_grid->node;
    RVar17 = 0;
    local_130 = pRVar13;
    do {
      RVar6 = ref_cell_nodes(pRVar13,RVar17,(REF_INT *)local_a8);
      local_d8 = (REF_NODE)CONCAT44(local_d8._4_4_,RVar17);
      if (RVar6 == 0) {
        uVar7 = ref_node_tet_quality(local_b8,(REF_INT *)local_a8,&local_f8);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0xa50,"ref_cavity_swap_tet_pass",(ulong)uVar7,"qual");
          local_140 = uVar7;
          goto LAB_00150460;
        }
        pRVar13 = local_130;
        if (local_f8 < ref_grid->adapt->swap_min_quality) {
          local_ec = -1;
          piVar11 = &DAT_0021bc08;
          lVar16 = 0;
          pRVar20 = (REF_CELL)0xc000000000000000;
          do {
            lVar18 = (long)piVar11[-2];
            lVar15 = (long)piVar11[-1];
            uVar7 = local_a8[lVar18];
            lVar9 = (long)(int)uVar7;
            uVar1 = local_a8[lVar15];
            if ((lVar9 < 0) ||
               (((((pRVar2 = ref_grid->cell[9]->ref_adj, pRVar2->nnode <= (int)uVar7 ||
                   (pRVar2->first[lVar9] == -1)) &&
                  ((pRVar2 = ref_grid->cell[10]->ref_adj, pRVar2->nnode <= (int)uVar7 ||
                   (pRVar2->first[lVar9] == -1)))) &&
                 ((pRVar2 = ref_grid->cell[0xb]->ref_adj, pRVar2->nnode <= (int)uVar7 ||
                  (pRVar2->first[lVar9] == -1)))) &&
                ((pRVar2 = ref_grid->cell[6]->ref_adj, pRVar2->nnode <= (int)uVar7 ||
                 (pRVar2->first[lVar9] == -1)))))) {
              if ((int)uVar1 < 0) {
LAB_0014fb47:
                local_13c = 1;
              }
              else {
                pRVar2 = ref_grid->cell[9]->ref_adj;
                if ((((pRVar2->nnode <= (int)uVar1) || (bVar19 = pRVar2->first[uVar1] == -1, bVar19)
                     ) && ((pRVar2 = ref_grid->cell[10]->ref_adj, pRVar2->nnode <= (int)uVar1 ||
                           (bVar19 = pRVar2->first[uVar1] == -1, bVar19)))) &&
                   ((pRVar2 = ref_grid->cell[0xb]->ref_adj, pRVar2->nnode <= (int)uVar1 ||
                    (bVar19 = pRVar2->first[uVar1] == -1, bVar19)))) {
                  pRVar2 = ref_grid->cell[6]->ref_adj;
                  if (pRVar2->nnode <= (int)uVar1) goto LAB_0014fb47;
                  bVar19 = pRVar2->first[uVar1] == -1;
                }
                local_13c = (uint)bVar19;
                if (bVar19 == false) goto LAB_0014fcf5;
              }
              local_128 = pRVar20;
              local_b0 = (long)*piVar11;
              uVar7 = ref_cell_local_gem(pRVar13,local_b8,uVar7,uVar1,(REF_BOOL *)&local_13c);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0xa5d,"ref_cavity_swap_tet_pass",(ulong)uVar7,"local gem");
                local_140 = uVar7;
                goto LAB_00150460;
              }
              pRVar13 = local_130;
              pRVar20 = local_128;
              if (local_13c != 0) {
                local_e0 = lVar18;
                uVar7 = local_a8[lVar18];
                local_e8 = lVar15;
                uVar1 = local_a8[lVar15];
                local_13c = 0;
                uVar8 = ref_cell_has_side(ref_grid->cell[3],uVar7,uVar1,&local_fc);
                uVar12 = (ulong)uVar8;
                if (uVar8 == 0) {
                  local_120 = uVar1;
                  local_11c = uVar7;
                  if (local_fc == 0) {
                    local_13c = 1;
                    uVar12 = 0;
                    lVar9 = local_e8;
                    lVar15 = local_e0;
                  }
                  else {
                    uVar7 = ref_swap_same_faceid(ref_grid,uVar7,uVar1,&local_bc);
                    lVar15 = local_e0;
                    lVar9 = local_e8;
                    if (uVar7 == 0) {
                      if (local_bc == 0) {
LAB_001500bc:
                        local_13c = 0;
                      }
                      else {
                        uVar7 = ref_swap_manifold(local_138,local_11c,local_120,&local_c0);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0xa20,"ref_cavity_edge_swap_boundary",(ulong)uVar7,
                                 "not allowed if creates a triangle or edge that exists");
                          uVar12 = (ulong)uVar7;
                          ref_grid = local_138;
                          goto LAB_0014fc38;
                        }
                        if (local_c0 == 0) goto LAB_001500bc;
                        uVar7 = ref_swap_conforming(local_138,local_11c,local_120,&local_c4);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0xa27,"ref_cavity_edge_swap_boundary",(ulong)uVar7,
                                 "normals and uv area must conform to geom");
                          uVar12 = (ulong)uVar7;
                          ref_grid = local_138;
                          goto LAB_0014fc38;
                        }
                        if (local_c4 == 0) goto LAB_001500bc;
                        uVar7 = ref_swap_quality(local_138,local_11c,local_120,&local_c8);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0xa2e,"ref_cavity_edge_swap_boundary",(ulong)uVar7,
                                 "require tri quality improvement");
                          uVar12 = (ulong)uVar7;
                          ref_grid = local_138;
                          goto LAB_0014fc38;
                        }
                        if (local_c8 == 0) goto LAB_001500bc;
                        uVar7 = ref_swap_ratio(local_138,local_11c,local_120,&local_cc);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0xa35,"ref_cavity_edge_swap_boundary",(ulong)uVar7,
                                 "require tri ratio in limits");
                          uVar12 = (ulong)uVar7;
                          ref_grid = local_138;
                          goto LAB_0014fc38;
                        }
                        if (local_cc == 0) goto LAB_001500bc;
                        local_13c = 1;
                      }
                      uVar12 = 0;
                      ref_grid = local_138;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0xa19,"ref_cavity_edge_swap_boundary",(ulong)uVar7,
                             "not allowed if a side of a edge or diff faceid");
                      uVar12 = (ulong)uVar7;
                      lVar9 = local_e8;
                      ref_grid = local_138;
                      lVar15 = local_e0;
                    }
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0xa12,"ref_cavity_edge_swap_boundary",(ulong)uVar8,"triangle side");
                  lVar9 = local_e8;
                  lVar15 = local_e0;
                }
LAB_0014fc38:
                if ((uint)uVar12 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0xa61,"ref_cavity_swap_tet_pass",uVar12,"surface geom and topo");
                  local_140 = (uint)uVar12;
                  goto LAB_00150460;
                }
                pRVar13 = local_130;
                pRVar20 = local_128;
                if (local_13c != 0) {
                  uVar7 = ref_cell_degree_with2
                                    (local_130,local_a8[lVar15],local_a8[lVar9],&local_d0);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0xa64,"ref_cavity_swap_tet_pass",(ulong)uVar7,"edge degree");
                    local_140 = uVar7;
                    goto LAB_00150460;
                  }
                  pRVar13 = local_130;
                  pRVar20 = local_128;
                  if (local_d0 <= ref_grid->adapt->swap_max_degree) {
                    uVar7 = ref_cavity_create((REF_CAVITY *)&local_118);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0xa66,"ref_cavity_swap_tet_pass",(ulong)uVar7,"create");
                      local_140 = uVar7;
                      goto LAB_00150460;
                    }
                    pRVar5 = (REF_CAVITY)CONCAT44(local_118._4_4_,(int)local_118);
                    RVar6 = ref_cavity_form_edge_swap
                                      (pRVar5,ref_grid,local_a8[lVar15],local_a8[lVar9],
                                       local_a8[local_b0]);
                    if (RVar6 == 0) {
                      if (pRVar5->state == REF_CAVITY_INCONSISTENT) {
                        uVar7 = ref_cavity_free(pRVar5);
                        if (uVar7 != 0) {
                          uVar10 = 0xa70;
                          goto LAB_001501ce;
                        }
                      }
                      else {
                        RVar6 = ref_cavity_check_visible(pRVar5);
                        if (RVar6 == 0) {
                          if (pRVar5->state == REF_CAVITY_VISIBLE) {
                            uVar7 = ref_cavity_ratio(pRVar5,(REF_BOOL *)&local_13c);
                            if (uVar7 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                     ,0xa79,"ref_cavity_swap_tet_pass",(ulong)uVar7,
                                     "post ratio limits");
                              ref_grid = local_138;
                              local_140 = uVar7;
                              goto LAB_00150460;
                            }
                            if (local_13c == 0) {
                              uVar7 = ref_cavity_free(pRVar5);
                              if (uVar7 != 0) {
                                uVar10 = 0xa7b;
                                goto LAB_001501ce;
                              }
                              goto LAB_001501e3;
                            }
                            uVar7 = ref_cavity_change(pRVar5,(REF_DBL *)&local_108,
                                                      (REF_DBL *)&local_110);
                            if (uVar7 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                     ,0xa7e,"ref_cavity_swap_tet_pass",(ulong)uVar7,"change");
                              ref_grid = local_138;
                              local_140 = uVar7;
                              goto LAB_00150460;
                            }
                            pRVar13 = (REF_CELL)CONCAT44(local_110._4_4_,(int)local_110);
                            if ((0.0001 < (double)pRVar13 - (double)local_108) &&
                               ((double)local_128 < (double)pRVar13)) {
                              local_ec = (int)lVar16;
                              local_128 = pRVar13;
                            }
                          }
                          uVar7 = ref_cavity_free(pRVar5);
                          if (uVar7 != 0) {
                            uVar10 = 0xa86;
                            goto LAB_001501ce;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0xa74,"ref_cavity_swap_tet_pass","check visible");
                          uVar7 = ref_cavity_free(pRVar5);
                          if (uVar7 != 0) {
                            uVar10 = 0xa75;
LAB_001501ce:
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,uVar10,"ref_cavity_swap_tet_pass",(ulong)uVar7,"free");
                            local_140 = uVar7;
                          }
                        }
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0xa6a,"ref_cavity_swap_tet_pass","form edge swap");
                      uVar7 = ref_cavity_free(pRVar5);
                      if (uVar7 != 0) {
                        uVar10 = 0xa6b;
                        goto LAB_001501ce;
                      }
                    }
LAB_001501e3:
                    pRVar13 = local_130;
                    ref_grid = local_138;
                    pRVar20 = local_128;
                    if (uVar7 != 0) goto LAB_00150460;
                  }
                }
              }
            }
            else {
              local_13c = 0;
            }
LAB_0014fcf5:
            iVar14 = local_ec;
            lVar16 = lVar16 + 1;
            piVar11 = piVar11 + 3;
          } while (lVar16 != 0xc);
          if (local_ec != -1) {
            uVar7 = ref_cavity_create((REF_CAVITY *)&local_118);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xa89,"ref_cavity_swap_tet_pass",(ulong)uVar7,"create");
              local_140 = uVar7;
              goto LAB_00150460;
            }
            lVar16 = (long)iVar14;
            pRVar5 = (REF_CAVITY)CONCAT44(local_118._4_4_,(int)local_118);
            uVar7 = ref_cavity_form_edge_swap
                              (pRVar5,ref_grid,local_a8[(int)(&DAT_0021bc00)[lVar16 * 3]],
                               local_a8[(int)(&DAT_0021bc04)[lVar16 * 3]],
                               local_a8[(int)(&DAT_0021bc08)[lVar16 * 3]]);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xa8f,"ref_cavity_swap_tet_pass",(ulong)uVar7,"cavity gem");
              local_140 = uVar7;
              goto LAB_00150460;
            }
            uVar7 = ref_cavity_check_visible(pRVar5);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xa90,"ref_cavity_swap_tet_pass",(ulong)uVar7,"enlarge viz");
              local_140 = uVar7;
              goto LAB_00150460;
            }
            if (pRVar5->debug != 0) {
              uVar7 = ref_cavity_change(pRVar5,(REF_DBL *)&local_108,(REF_DBL *)&local_110);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0xa92,"ref_cavity_swap_tet_pass",(ulong)uVar7,"change");
                local_140 = uVar7;
                goto LAB_00150460;
              }
              printf("cavity accepted %f -> %f\n",local_108,CONCAT44(local_110._4_4_,(int)local_110)
                    );
            }
            uVar7 = ref_cavity_replace(pRVar5);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xa95,"ref_cavity_swap_tet_pass",(ulong)uVar7,"replace");
              local_140 = uVar7;
              goto LAB_00150460;
            }
            uVar7 = ref_cavity_free(pRVar5);
            pRVar13 = local_130;
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xa96,"ref_cavity_swap_tet_pass",(ulong)uVar7,"free");
              local_140 = uVar7;
              goto LAB_00150460;
            }
          }
        }
      }
      RVar17 = (int)local_d8 + 1;
    } while (RVar17 < pRVar13->max);
  }
  local_140 = 0;
LAB_00150460:
  if (local_140 == 0) {
    local_140 = 0;
    if ((ref_grid->surf != 0) && (pRVar13 = ref_grid->cell[0], local_140 = 0, 0 < pRVar13->max)) {
      local_d8 = local_138->node;
      local_128 = local_138->cell[3];
      iVar14 = 0;
      do {
        RVar6 = ref_cell_nodes(pRVar13,iVar14,(REF_INT *)local_a8);
        if ((RVar6 == 0) &&
           (lVar16 = (long)(int)local_a8[0], local_d8->ref_mpi->id == local_d8->part[lVar16])) {
          lVar9 = (long)(int)local_a8[1];
          local_130 = (REF_CELL)CONCAT44(local_130._4_4_,local_a8[0]);
          local_140 = ref_cell_list_with2(local_128,local_a8[0],local_a8[1],2,(REF_INT *)&local_118,
                                          (REF_INT *)&local_f8);
          if (local_140 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xac5,"ref_cavity_surf_geom_edge_pass",(ulong)local_140,"tris");
            ref_grid_00 = local_138;
            pRVar3 = local_138->node->real;
            printf(" %.16e %.16e %.16e\n",pRVar3[lVar16 * 0xf],pRVar3[lVar16 * 0xf + 1],
                   pRVar3[lVar16 * 0xf + 2]);
            pRVar3 = ref_grid_00->node->real;
            printf(" %.16e %.16e %.16e\n",pRVar3[lVar9 * 0xf],pRVar3[lVar9 * 0xf + 1],
                   pRVar3[lVar9 * 0xf + 2]);
            ref_export_tec_surf(ref_grid_00,"ref_cavity_geom_edge_fail.tec");
            goto LAB_001508c1;
          }
          if (0 < (int)local_118) {
            lVar16 = 0;
            do {
              RVar17 = *(REF_INT *)((long)&local_f8 + lVar16 * 4);
              local_140 = ref_cell_nodes(local_128,RVar17,(REF_INT *)local_a8);
              if (local_140 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0xac8,"ref_cavity_surf_geom_edge_pass",(ulong)local_140,"cell nodes");
                goto LAB_001508c1;
              }
              local_140 = ref_geom_tri_norm_deviation
                                    (local_138,(REF_INT *)local_a8,(REF_DBL *)&local_108);
              if (local_140 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0xac9,"ref_cavity_surf_geom_edge_pass",(ulong)local_140,"nd");
                goto LAB_001508c1;
              }
              if ((double)local_108 < 0.5) {
                local_140 = ref_cavity_create((REF_CAVITY *)&local_110);
                if (local_140 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0xacb,"ref_cavity_surf_geom_edge_pass",(ulong)local_140,"create");
                  goto LAB_001508c1;
                }
                pRVar5 = (REF_CAVITY)CONCAT44(local_110._4_4_,(int)local_110);
                pRVar5->ref_grid = local_138;
                pRVar5->node = (REF_INT)local_130;
                local_140 = ref_cavity_add_tri(pRVar5,RVar17);
                if (local_140 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0xacd,"ref_cavity_surf_geom_edge_pass",(ulong)local_140,"insert tri");
                  goto LAB_001508c1;
                }
                local_140 = ref_cavity_enlarge_conforming(pRVar5);
                if (local_140 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0xace,"ref_cavity_surf_geom_edge_pass",(ulong)local_140,"enlarge tri");
                  goto LAB_001508c1;
                }
                if (pRVar5->state == REF_CAVITY_VISIBLE) {
                  local_140 = ref_cavity_normdev(pRVar5,&local_fc);
                  if (local_140 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0xad0,"ref_cavity_surf_geom_edge_pass",(ulong)local_140,"normdev tri");
                    goto LAB_001508c1;
                  }
                  if ((local_fc != 0) && (local_140 = ref_cavity_replace(pRVar5), local_140 != 0)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0xad2,"ref_cavity_surf_geom_edge_pass",(ulong)local_140,"replace tri");
                    goto LAB_001508c1;
                  }
                }
                local_140 = ref_cavity_free(pRVar5);
                if (local_140 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0xad5,"ref_cavity_surf_geom_edge_pass",(ulong)local_140,"free");
                  goto LAB_001508c1;
                }
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < (int)local_118);
          }
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 < pRVar13->max);
      local_140 = 0;
    }
LAB_001508c1:
    if (local_140 == 0) {
      uVar7 = 0;
      if ((local_138->surf != 0) && (pRVar13 = local_138->cell[3], 0 < pRVar13->max)) {
        pRVar4 = local_138->node;
        iVar14 = 0;
        do {
          RVar6 = ref_cell_nodes(pRVar13,iVar14,(REF_INT *)local_a8);
          if ((RVar6 == 0) && (pRVar4->ref_mpi->id == pRVar4->part[(int)local_a8[0]])) {
            uVar7 = ref_geom_is_a(local_138->geom,local_a8[0],1,(REF_BOOL *)&local_118);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xaea,"ref_cavity_surf_geom_face_pass",(ulong)uVar7,"n");
              goto LAB_00150c09;
            }
            if ((int)local_118 == 0) {
              uVar7 = ref_geom_tri_norm_deviation(local_138,(REF_INT *)local_a8,&local_f8);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0xaee,"ref_cavity_surf_geom_face_pass",(ulong)uVar7,"nd");
                goto LAB_00150c09;
              }
              if (local_f8 < 0.1) {
                uVar7 = ref_cavity_create(&local_108);
                pRVar5 = local_108;
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0xaf0,"ref_cavity_surf_geom_face_pass",(ulong)uVar7,"create");
                  goto LAB_00150c09;
                }
                uVar7 = ref_cavity_form_ball(local_108,local_138,local_a8[0]);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0xaf1,"ref_cavity_surf_geom_face_pass",(ulong)uVar7,"insert ball");
                  goto LAB_00150c09;
                }
                uVar7 = ref_cavity_enlarge_conforming(pRVar5);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0xaf2,"ref_cavity_surf_geom_face_pass",(ulong)uVar7,"enlarge tri");
                  goto LAB_00150c09;
                }
                if (pRVar5->state == REF_CAVITY_VISIBLE) {
                  uVar7 = ref_cavity_normdev(pRVar5,(REF_BOOL *)&local_110);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0xaf4,"ref_cavity_surf_geom_face_pass",(ulong)uVar7,"normdev tri");
                    goto LAB_00150c09;
                  }
                  if (((int)local_110 != 0) && (uVar7 = ref_cavity_replace(pRVar5), uVar7 != 0)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0xaf6,"ref_cavity_surf_geom_face_pass",(ulong)uVar7,"replace tri");
                    goto LAB_00150c09;
                  }
                }
                uVar7 = ref_cavity_free(pRVar5);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0xaf9,"ref_cavity_surf_geom_face_pass",(ulong)uVar7,"free");
                  goto LAB_00150c09;
                }
              }
            }
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < pRVar13->max);
        uVar7 = 0;
      }
LAB_00150c09:
      local_140 = 0;
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0xb02,"ref_cavity_pass",(ulong)uVar7,"cavity geom edge");
        local_140 = uVar7;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0xb01,"ref_cavity_pass",(ulong)local_140,"cavity geom edge");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0xb00,
           "ref_cavity_pass",(ulong)local_140,"cavity swap pass");
  }
  return local_140;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_pass(REF_GRID ref_grid) {
  RSS(ref_cavity_swap_tet_pass(ref_grid), "cavity swap pass");
  RSS(ref_cavity_surf_geom_edge_pass(ref_grid), "cavity geom edge");
  RSS(ref_cavity_surf_geom_face_pass(ref_grid), "cavity geom edge");
  return REF_SUCCESS;
}